

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.cc
# Opt level: O1

void testing::internal::InitGoogleMockImpl<wchar_t>(int *argc,wchar_t **argv)

{
  int iVar1;
  _Alloc_hider str;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  bool *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *streamable;
  int iVar3;
  internal *this;
  long lVar4;
  string arg_string;
  string local_50;
  
  InitGoogleTest(argc,argv);
  if ((0 < *argc) && (*argc != 1)) {
    iVar3 = 1;
    streamable = extraout_RDX;
    do {
      this = (internal *)(argv + iVar3);
      StreamableToString<wchar_t*>(&local_50,this,(wchar_t **)streamable);
      str._M_p = local_50._M_dataplus._M_p;
      bVar2 = ParseGoogleMockBoolFlag(local_50._M_dataplus._M_p,(char *)this,value);
      streamable = value_00;
      if (bVar2) {
LAB_002cec93:
        iVar1 = *argc;
        if (iVar1 != iVar3) {
          streamable = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (argv + (long)iVar3 + 1);
          lVar4 = 0;
          do {
            *(pointer *)((long)streamable + lVar4 * 8 + -8) = (&streamable->_M_dataplus)[lVar4]._M_p
            ;
            lVar4 = lVar4 + 1;
          } while (iVar1 - iVar3 != (int)lVar4);
        }
        *argc = iVar1 + -1;
        iVar3 = iVar3 + -1;
      }
      else {
        bVar2 = ParseGoogleMockStringFlag<std::__cxx11::string>(str._M_p,(char *)this,value_00);
        streamable = value_01;
        if (bVar2) goto LAB_002cec93;
        bVar2 = ParseGoogleMockIntFlag(str._M_p,(char *)this,(int32_t *)value_01);
        streamable = extraout_RDX_00;
        if (bVar2) goto LAB_002cec93;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
        streamable = extraout_RDX_01;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != *argc);
  }
  return;
}

Assistant:

void InitGoogleMockImpl(int* argc, CharType** argv) {
  // Makes sure Google Test is initialized.  InitGoogleTest() is
  // idempotent, so it's fine if the user has already called it.
  InitGoogleTest(argc, argv);
  if (*argc <= 0) return;

  for (int i = 1; i != *argc; i++) {
    const std::string arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    // Do we see a Google Mock flag?
    if (ParseGoogleMockBoolFlag(arg, "catch_leaked_mocks",
                                &GMOCK_FLAG(catch_leaked_mocks)) ||
        ParseGoogleMockStringFlag(arg, "verbose", &GMOCK_FLAG(verbose)) ||
        ParseGoogleMockIntFlag(arg, "default_mock_behavior",
                               &GMOCK_FLAG(default_mock_behavior))) {
      // Yes.  Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    }
  }
}